

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.h
# Opt level: O3

int __thiscall HttpServer::GET(HttpServer *this,char *url_pattern,handler_t *callback)

{
  undefined8 uVar1;
  allocator local_51;
  _Any_data local_50;
  code *local_40;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,url_pattern,&local_51);
  std::function<void_(HttpRequest_&)>::function
            ((function<void_(HttpRequest_&)> *)&local_50,callback);
  httprouter::node::addRoute(&this->no,&local_30,(handler_t *)&local_50);
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  uVar1 = std::__cxx11::string::~string((string *)&local_30);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(uVar1);
}

Assistant:

int GET(char *url_pattern, handler_t callback)
    {
        no.addRoute(url_pattern, callback);
    }